

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptRegExpConstructor::GetEnumerator
          (JavascriptRegExpConstructor *this,JavascriptStaticEnumerator *enumerator,
          EnumeratorFlags flags,ScriptContext *requestContext,EnumeratorCache *enumeratorCache)

{
  BOOL BVar1;
  Recycler *alloc;
  JavascriptRegExpEnumerator *this_00;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  local_60 = (undefined1  [8])&JavascriptRegExpEnumerator::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_7d8fef8;
  data.filename._0_4_ = 0x2a;
  data._32_8_ = enumeratorCache;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((((((this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject
                          .super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr)->recycler,
                     (TrackAllocData *)local_60);
  this_00 = (JavascriptRegExpEnumerator *)new<Memory::Recycler>(0x20,alloc,0x38bbb2);
  JavascriptRegExpEnumerator::JavascriptRegExpEnumerator(this_00,this,flags,requestContext);
  BVar1 = DynamicObject::GetEnumeratorWithPrefix
                    ((DynamicObject *)this,(JavascriptEnumerator *)this_00,enumerator,flags,
                     requestContext,(EnumeratorCache *)data._32_8_);
  return BVar1;
}

Assistant:

BOOL JavascriptRegExpConstructor::GetEnumerator(JavascriptStaticEnumerator * enumerator, EnumeratorFlags flags, ScriptContext* requestContext, EnumeratorCache * enumeratorCache)
    {
        return GetEnumeratorWithPrefix(
            RecyclerNew(GetScriptContext()->GetRecycler(), JavascriptRegExpEnumerator, this, flags, requestContext),
            enumerator, flags, requestContext, enumeratorCache);
    }